

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mhitm.c
# Opt level: O2

int mattackm(monst *magr,monst *mdef)

{
  int *piVar1;
  uchar uVar2;
  permonst *mptr;
  permonst *ppVar3;
  permonst *ppVar4;
  char *pcVar5;
  byte bVar6;
  long lVar7;
  byte bVar8;
  boolean bVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  obj *poVar15;
  attack *mattk;
  monst *pmVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  char *pcVar20;
  int x;
  byte bVar21;
  ulong uVar22;
  bool bVar23;
  int local_1c8;
  int aiStack_1b0 [2];
  int res [6];
  attack alt_attk;
  char buf [256];
  
  if (mdef == (monst *)0x0 || magr == (monst *)0x0) {
    return 0;
  }
  if ((*(uint *)&magr->field_0x60 & 0xc0000) != 0x40000) {
    return 0;
  }
  mptr = magr->data;
  ppVar3 = mdef->data;
  if (((mptr == mons + 0x78) && (magr->mx != mdef->mx)) && (magr->my != mdef->my)) {
    return 0;
  }
  iVar10 = find_mac(mdef);
  iVar10 = (uint)magr->m_lev + iVar10;
  uVar11 = *(uint *)&mdef->field_0x60;
  if ((uVar11 & 0x2c0000) != 0x40000) {
    iVar10 = iVar10 + 4;
    uVar11 = uVar11 & 0xfff7ffff;
    *(uint *)&mdef->field_0x60 = uVar11;
  }
  if ((char)uVar11 < '\0') {
    *(uint *)&mdef->field_0x60 = uVar11 & 0xffffff7f;
    newsym((int)mdef->mx,(int)mdef->my);
    if (mdef->wormno == '\0') {
      if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001bba8d;
      if (u.uprops[0x1e].intrinsic == 0) {
        if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bb934;
        if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bb92b;
      }
      else {
LAB_001bb92b:
        if (ublindf == (obj *)0x0) goto LAB_001bb7e2;
LAB_001bb934:
        if (ublindf->oartifact != '\x1d') goto LAB_001bb7e2;
      }
      if (((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
          (((youmonst.data)->mflags3 & 0x100) == 0)) ||
         (((viz_array[mdef->my][mdef->mx] & 1U) == 0 || ((mdef->data->mflags3 & 0x200) == 0))))
      goto LAB_001bb7e2;
    }
    else {
      bVar9 = worm_known(level,mdef);
      if (bVar9 == '\0') goto LAB_001bb7e2;
    }
LAB_001bba8d:
    uVar11 = *(uint *)&mdef->field_0x60;
    if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0)) {
      if ((uVar11 & 0x280) == 0) goto LAB_001bbadc;
    }
    else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bbadc:
      if ((u._1052_1_ & 0x20) == 0) {
        if (((mdef->data->mflags1 & 0x10000) == 0) &&
           ((poVar15 = which_armor(mdef,4), poVar15 == (obj *)0x0 ||
            (poVar15 = which_armor(mdef,4), poVar15->otyp != 0x4f)))) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bbb39;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bbb34;
          }
          else {
LAB_001bbb34:
            if (ublindf != (obj *)0x0) {
LAB_001bbb39:
              if (ublindf->oartifact == '\x1d') goto LAB_001bbca4;
            }
            if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
                 (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
                 youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001bb7e2;
          }
LAB_001bbca4:
          if ((u.uprops[0x19].extrinsic != 0) &&
             ((u.uprops[0x19].blocked == 0 &&
              (iVar13 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar13 < 0x41))))
          goto LAB_001bb7e2;
        }
        if ((u.uprops[0x42].intrinsic == 0) &&
           ((u.uprops[0x42].extrinsic == 0 && (bVar9 = match_warn_of_mon(mdef), bVar9 == '\0')))) {
          if (u.usleep == 0) {
            pcVar18 = a_monnam(mdef);
            pcVar20 = "Suddenly, you notice %s.";
          }
          else {
            if ((mdef->data->geno & 0x1000) == 0) {
              pcVar18 = m_monnam(mdef);
              pcVar18 = makeplural(pcVar18);
            }
            else {
              pcVar18 = a_monnam(mdef);
            }
            pcVar20 = "You dream of %s.";
          }
          pline(pcVar20,pcVar18);
        }
      }
    }
  }
LAB_001bb7e2:
  if ((mptr->mflags2 & 0x10) != 0) {
    iVar10 = iVar10 + (uint)((ppVar3->mflags2 >> 7 & 1) != 0);
  }
  bVar23 = false;
  if ((viz_array[magr->my][magr->mx] & 2U) == 0) goto LAB_001bbf5c;
  if ((viz_array[mdef->my][mdef->mx] & 2U) == 0) {
    bVar23 = false;
    goto LAB_001bbf5c;
  }
  if ((magr->wormno == '\0') || (bVar9 = worm_known(level,magr), bVar9 != '\0')) {
    uVar11 = *(uint *)&magr->field_0x60;
    if (((uVar11 & 2) == 0) || ((u.uprops[0xc].intrinsic != 0 || (u.uprops[0xc].extrinsic != 0)))) {
      if ((uVar11 & 0x280) == 0) goto LAB_001bb94a;
    }
    else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bb94a:
      bVar23 = true;
      if ((u._1052_1_ & 0x20) == 0) goto LAB_001bbf5c;
    }
  }
  if (((magr->data->mflags1 & 0x10000) == 0) &&
     ((poVar15 = which_armor(magr,4), poVar15 == (obj *)0x0 ||
      (poVar15 = which_armor(magr,4), poVar15->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bb9b1;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bb9ac;
    }
    else {
LAB_001bb9ac:
      if (ublindf != (obj *)0x0) {
LAB_001bb9b1:
        if (ublindf->oartifact == '\x1d') goto LAB_001bbbd4;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (bVar23 = true, u.uprops[0x19].blocked == 0))
      goto LAB_001bbf5c;
    }
LAB_001bbbd4:
    if ((u.uprops[0x19].extrinsic != 0) && (u.uprops[0x19].blocked == 0)) {
      iVar13 = dist2((int)magr->mx,(int)magr->my,(int)u.ux,(int)u.uy);
      bVar23 = true;
      if (iVar13 < 0x41) goto LAB_001bbf5c;
    }
  }
  bVar23 = true;
  if (((u.uprops[0x42].intrinsic != 0) || (bVar23 = true, u.uprops[0x42].extrinsic != 0)) ||
     (bVar9 = match_warn_of_mon(magr), bVar9 != '\0')) goto LAB_001bbf5c;
  if (mdef->wormno == '\0') {
    if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001bbded;
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bbd63;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bbd5a;
    }
    else {
LAB_001bbd5a:
      if (ublindf == (obj *)0x0) goto LAB_001bbe37;
LAB_001bbd63:
      if (ublindf->oartifact != '\x1d') goto LAB_001bbe37;
    }
    if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
        (((youmonst.data)->mflags3 & 0x100) != 0)) &&
       (((viz_array[mdef->my][mdef->mx] & 1U) != 0 && ((mdef->data->mflags3 & 0x200) != 0))))
    goto LAB_001bbded;
  }
  else {
    bVar9 = worm_known(level,mdef);
    if (bVar9 != '\0') {
LAB_001bbded:
      uVar11 = *(uint *)&mdef->field_0x60;
      if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) || (u.uprops[0xc].extrinsic != 0))
      {
        if ((uVar11 & 0x280) == 0) goto LAB_001bbe2a;
      }
      else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bbe2a:
        if ((u._1052_1_ & 0x20) == 0) goto LAB_001bbf5c;
      }
    }
  }
LAB_001bbe37:
  if (((mdef->data->mflags1 & 0x10000) == 0) &&
     ((poVar15 = which_armor(mdef,4), poVar15 == (obj *)0x0 ||
      (poVar15 = which_armor(mdef,4), poVar15->otyp != 0x4f)))) {
    if (u.uprops[0x1e].intrinsic == 0) {
      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bbe83;
      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bbe7e;
    }
    else {
LAB_001bbe7e:
      if (ublindf != (obj *)0x0) {
LAB_001bbe83:
        if (ublindf->oartifact == '\x1d') goto LAB_001bbf0f;
      }
      if ((((youmonst.data == mons + 0x31 || youmonst.data == mons + 0x1e) ||
           (u.uprops[0x19].extrinsic != 0 || u.uprops[0x19].intrinsic != 0)) ||
           youmonst.data == mons + 0x32) && (u.uprops[0x19].blocked == 0)) goto LAB_001bbf5c;
    }
LAB_001bbf0f:
    if ((u.uprops[0x19].extrinsic != 0) &&
       ((u.uprops[0x19].blocked == 0 &&
        (iVar13 = dist2((int)mdef->mx,(int)mdef->my,(int)u.ux,(int)u.uy), iVar13 < 0x41))))
    goto LAB_001bbf5c;
  }
  if ((u.uprops[0x42].intrinsic == 0) && (u.uprops[0x42].extrinsic == 0)) {
    bVar9 = match_warn_of_mon(mdef);
    bVar23 = bVar9 != '\0';
  }
LAB_001bbf5c:
  vis = bVar23;
  magr->mlstmv = moves;
  uVar22 = 0;
  bVar6 = 0;
  do {
    if (uVar22 == 6) {
      return (uint)bVar6;
    }
    res[uVar22] = 0;
    iVar13 = (int)uVar22;
    mattk = getmattk(mptr,iVar13,res,&alt_attk);
    otmp = (obj *)0x0;
    switch(mattk->aatyp) {
    case '\x01':
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\x06':
    case '\x10':
      goto switchD_001bc05d_caseD_1;
    case '\a':
      if (((uVar22 < 2) || (res[uVar22 - 1] != 1)) || (aiStack_1b0[uVar22] != 1)) goto LAB_001bc569;
      iVar13 = hitmm(magr,mdef,mattk);
      res[uVar22] = iVar13;
      bVar21 = 1;
      break;
    case '\b':
    case '\t':
    case '\n':
    case '\f':
    case '\x0e':
switchD_001bc05d_caseD_8:
      uVar11 = res[uVar22];
      bVar21 = 0;
      goto LAB_001be042;
    case '\v':
      if ((u.usteed == mdef) || (((u._1052_1_ & 1) != 0 && (u.ustuck == magr)))) goto LAB_001bc569;
      iVar13 = rnd(iVar13 + 0x14);
      if (iVar13 < iVar10) {
        uVar11 = 0;
        if (mdef->data->msize < 4) {
          poVar15 = (obj *)&mdef->minvent;
          if (vis != '\0') {
            pcVar18 = Monnam(magr);
            sprintf(buf,"%s swallows",pcVar18);
            pcVar18 = mon_nam(mdef);
            pline("%s %s.",buf,pcVar18);
          }
          while (poVar15 = poVar15->nobj, poVar15 != (obj *)0x0) {
            snuff_lit(poVar15);
          }
          x = (int)magr->mx;
          uVar11 = (uint)magr->my;
          iVar12 = (int)mdef->mx;
          iVar13 = (int)mdef->my;
          remove_monster(level,x,uVar11);
          place_monster(magr,iVar12,iVar13);
          aiStack_1b0[1] = uVar11;
          newsym(x,uVar11);
          newsym(iVar12,iVar13);
          uVar11 = mdamagem(magr,mdef,mattk);
          if ((~uVar11 & 6) != 0) {
            pmVar16 = magr;
            if (((uVar11 & 2) == 0) && (pmVar16 = mdef, (uVar11 & 4) == 0)) {
              if ((viz_array[iVar13][iVar12] & 2U) != 0) {
                pcVar18 = Monnam(mdef);
                pline("%s is regurgitated!",pcVar18);
              }
              place_monster(magr,x,aiStack_1b0[1]);
              place_monster(mdef,iVar12,iVar13);
              newsym(x,aiStack_1b0[1]);
            }
            else {
              place_monster(pmVar16,iVar12,iVar13);
            }
            newsym(iVar12,iVar13);
          }
        }
        res[uVar22] = uVar11;
        bVar21 = 1;
      }
      else {
        missmm(magr,mdef,mattk);
        bVar21 = 0;
      }
      break;
    case '\r':
      if ((magr->field_0x61 & 1) == 0) {
        if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
          noises(magr,mattk);
        }
        else {
          pcVar18 = Monnam(magr);
          pline("%s explodes!",pcVar18);
        }
        uVar11 = mdamagem(magr,mdef,mattk);
        if ((uVar11 & 4) == 0) {
          mondead(magr);
          if (0 < magr->mhp) {
            res[uVar22] = uVar11;
            bVar21 = 1;
            if (uVar11 != 0) break;
            goto LAB_001bc540;
          }
          uVar11 = uVar11 | 4;
        }
        if (magr->mtame != '\0') {
          pline("You have a %s feeling for a moment, then it passes.","melancholy");
        }
        res[uVar22] = uVar11;
        bVar21 = 1;
        break;
      }
      res[uVar22] = 0;
LAB_001bc540:
      uVar11 = 0;
      goto LAB_001be060;
    case '\x0f':
      if (vis != '\0') {
        pcVar18 = Monnam(magr);
        sprintf(buf,"%s gazes at",pcVar18);
        pcVar18 = mon_nam(mdef);
        pline("%s %s...",buf,pcVar18);
      }
      if ((((*(uint *)&magr->field_0x60 & 0x20100) == 0x20000) &&
          (((*(uint *)&magr->field_0x60 & 2) == 0 || ((mdef->data->mflags1 & 0x1000000) != 0)))) &&
         ((*(uint *)&mdef->field_0x60 & 0xa0000) == 0x20000)) {
        if ((magr->data == mons + 0x127) && (bVar9 = mon_reflects(mdef,(char *)0x0), bVar9 != '\0'))
        {
          if (mdef->wormno == '\0') {
            if ((viz_array[mdef->my][mdef->mx] & 2U) != 0) goto LAB_001bd6f3;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd127;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd11e;
            }
            else {
LAB_001bd11e:
              if (ublindf == (obj *)0x0) goto LAB_001bd74a;
LAB_001bd127:
              if (ublindf->oartifact != '\x1d') goto LAB_001bd74a;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[mdef->my][mdef->mx] & 1U) != 0)) && ((mdef->data->mflags3 & 0x200) != 0)
               ) goto LAB_001bd6f3;
          }
          else {
            bVar9 = worm_known(level,mdef);
            if (bVar9 != '\0') {
LAB_001bd6f3:
              uVar11 = *(uint *)&mdef->field_0x60;
              if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar11 & 0x280) == 0) goto LAB_001bd732;
              }
              else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bd732:
                if ((u._1052_1_ & 0x20) == 0) {
                  mon_reflects(mdef,"The gaze is reflected away by %s %s.");
                }
              }
            }
          }
LAB_001bd74a:
          if ((mdef->field_0x62 & 2) != 0) {
            bVar9 = mon_reflects(magr,(char *)0x0);
            if (bVar9 == '\0') {
              if (((mdef->field_0x60 & 2) != 0) && ((magr->data->mflags1 & 0x1000000) == 0)) {
                if (magr->wormno == '\0') {
                  if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001be1e4;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001be1db;
LAB_001be348:
                      if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                          (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                         (iVar13 = 0, (viz_array[magr->my][magr->mx] & 1U) != 0)) {
                        if ((magr->data->mflags3 & 0x200) == 0) goto LAB_001bc564;
                        goto LAB_001be3b7;
                      }
                    }
                    else {
LAB_001be1db:
                      if (ublindf != (obj *)0x0) {
LAB_001be1e4:
                        if (ublindf->oartifact == '\x1d') goto LAB_001be348;
                      }
                    }
                    iVar13 = 0;
                    goto LAB_001bc564;
                  }
                }
                else {
                  bVar9 = worm_known(level,magr);
                  if (bVar9 == '\0') goto LAB_001be163;
                }
LAB_001be3b7:
                uVar11 = *(uint *)&magr->field_0x60;
                if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar11 & 0x280) != 0) goto LAB_001be163;
                }
                else {
                  iVar13 = 0;
                  if (((uVar11 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                  goto LAB_001bc564;
                }
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar18 = Monnam(magr);
                  iVar13 = pronoun_gender(level,magr);
                  pline("%s doesn\'t seem to notice that %s gaze was reflected.",pcVar18,
                        genders[iVar13].his);
                }
                iVar13 = 0;
                goto LAB_001bc564;
              }
              if (magr->wormno == '\0') {
                if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001be24b;
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd898;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd88f;
                }
                else {
LAB_001bd88f:
                  if (ublindf == (obj *)0x0) goto LAB_001be2ac;
LAB_001bd898:
                  if (ublindf->oartifact != '\x1d') goto LAB_001be2ac;
                }
                if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                     (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                    ((viz_array[magr->my][magr->mx] & 1U) != 0)) &&
                   ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001be24b;
              }
              else {
                bVar9 = worm_known(level,magr);
                if (bVar9 != '\0') {
LAB_001be24b:
                  uVar11 = *(uint *)&magr->field_0x60;
                  if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                     (u.uprops[0xc].extrinsic != 0)) {
                    if ((uVar11 & 0x280) == 0) goto LAB_001be28a;
                  }
                  else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
                  {
LAB_001be28a:
                    if ((u._1052_1_ & 0x20) == 0) {
                      Monnam(magr);
                      pline("%s is turned to stone!");
                    }
                  }
                }
              }
LAB_001be2ac:
              monstone(magr);
              iVar13 = (uint)(magr->mhp < 1) << 2;
              goto LAB_001bc564;
            }
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001be11a;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd846;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd83d;
              }
              else {
LAB_001bd83d:
                if (ublindf == (obj *)0x0) goto LAB_001be163;
LAB_001bd846:
                if (ublindf->oartifact != '\x1d') goto LAB_001be163;
              }
              if ((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) {
                iVar13 = 0;
                if (((viz_array[magr->my][magr->mx] & 1U) == 0) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001bc564;
                goto LAB_001be11a;
              }
            }
            else {
              bVar9 = worm_known(level,magr);
              if (bVar9 != '\0') {
LAB_001be11a:
                uVar11 = *(uint *)&magr->field_0x60;
                if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar11 & 0x280) != 0) goto LAB_001be163;
                }
                else {
                  iVar13 = 0;
                  if (((uVar11 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
                  goto LAB_001bc564;
                }
                iVar13 = 0;
                if ((u._1052_1_ & 0x20) == 0) {
                  mon_reflects(magr,"The gaze is reflected away by %s %s.");
                }
                goto LAB_001bc564;
              }
            }
LAB_001be163:
            iVar13 = 0;
            goto LAB_001bc564;
          }
        }
        iVar13 = mdamagem(magr,mdef,mattk);
      }
      else if (vis == '\0') {
        iVar13 = 0;
      }
      else {
        iVar13 = 0;
        pline("but nothing happens.");
      }
LAB_001bc564:
      res[uVar22] = iVar13;
LAB_001bc569:
      bVar21 = 0;
      break;
    default:
      if (mattk->aatyp != 0xfe) goto switchD_001bc05d_caseD_8;
      if ((magr->weapon_check == '\x01') || (magr->mw == (obj *)0x0)) {
        magr->weapon_check = '\x03';
        iVar12 = mon_wield_item(magr);
        if (iVar12 != 0) {
          return 0;
        }
      }
      possibly_unwield(magr,'\0');
      poVar15 = magr->mw;
      otmp = poVar15;
      if (poVar15 != (obj *)0x0) {
        if ((vis != '\0') && (flags.verbose != '\0')) {
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bc166;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bc15d;
LAB_001bc98a:
            uVar11 = *(uint *)&magr->field_0x60;
            if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar11 & 0x280) == 0) goto LAB_001bcad4;
            }
            else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bcad4:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar18 = mon_nam(mdef);
                strcpy(buf,pcVar18);
                pcVar18 = Monnam(magr);
                pcVar20 = "thrusts";
                if ((*(ushort *)&objects[poVar15->otyp].field_0x11 & 4) == 0) {
                  pcVar20 = "swings";
                }
                iVar12 = pronoun_gender(level,magr);
                pcVar5 = genders[iVar12].his;
                pcVar19 = singular(poVar15,xname);
                pline("%s %s %s %s at %s.",pcVar18,pcVar20,pcVar5,pcVar19,buf);
              }
            }
          }
          else {
LAB_001bc15d:
            if (ublindf != (obj *)0x0) {
LAB_001bc166:
              if (ublindf->oartifact == '\x1d') goto LAB_001bc98a;
            }
          }
        }
        iVar12 = hitval(otmp,mdef);
        iVar10 = iVar10 + iVar12;
      }
switchD_001bc05d_caseD_1:
      iVar12 = distmin((int)magr->mx,(int)magr->my,(int)mdef->mx,(int)mdef->my);
      if (1 < iVar12) {
        return 0;
      }
      if ((((magr->field_0x62 & 0x20) == 0) && (u.uprops[0x15].intrinsic == 0)) &&
         ((u.uprops[0x15].extrinsic == 0 && (otmp != (obj *)0x0)))) {
        ppVar3 = mdef->data;
        if (ppVar3 == mons + 0xdb) {
          if ((mattk->aatyp != 0xfe) && ((magr->mintrinsics & 8) != 0)) goto LAB_001bc181;
LAB_001bc1a6:
          bVar21 = 0;
          break;
        }
        if (mattk->aatyp != 0xfe) {
LAB_001bc181:
          if (ppVar3 == mons + 0xb || ppVar3 == mons + 0xc) goto LAB_001bc1a6;
        }
      }
      iVar12 = rnd(iVar13 + 0x14);
      dieroll = iVar12;
      iVar13 = iVar10;
      if (otmp != (obj *)0x0) {
        iVar13 = hitval(otmp,mdef);
        iVar13 = iVar10 - iVar13;
      }
      if (iVar12 < iVar10) {
        iVar10 = hitmm(magr,mdef,mattk);
        res[uVar22] = iVar10;
        if (mdef->data == mons + 0xd6) {
          if (otmp != (obj *)0x0) goto LAB_001bc27d;
        }
        else if (mdef->data == mons + 0xd5 && otmp != (obj *)0x0) {
LAB_001bc27d:
          if ((((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x1f0) == 0xb0) && (1 < mdef->mhp)) &&
             ((mdef->field_0x61 & 1) == 0)) {
            pmVar16 = clone_mon(mdef,'\0','\0');
            if ((pmVar16 != (monst *)0x0) && (vis != '\0')) {
              pcVar18 = Monnam(mdef);
              strcpy(buf,pcVar18);
              pcVar18 = mon_nam(magr);
              pline("%s divides as %s hits it!",buf,pcVar18);
            }
            bVar21 = 1;
            iVar10 = iVar13;
            break;
          }
        }
        bVar21 = 1;
        iVar10 = iVar13;
      }
      else {
        missmm(magr,mdef,mattk);
        bVar21 = 0;
        iVar10 = iVar13;
      }
    }
    uVar11 = res[uVar22];
    if ((uVar11 & 4) == 0) {
      uVar11 = uVar11 & 2;
      ppVar3 = mdef->data;
      ppVar4 = magr->data;
      lVar7 = 4;
      do {
        lVar17 = lVar7;
        if (lVar17 == 10) goto LAB_001be021;
        lVar7 = lVar17 + 1;
      } while (ppVar3->mattk[lVar17 + -4].aatyp != '\0');
      bVar8 = ppVar3->mattk[lVar17 + -4].damn;
      uVar14 = (uint)bVar8;
      if (bVar8 == 0) {
        bVar8 = ppVar3->mattk[lVar17 + -4].damd;
        if (bVar8 != 0) {
          uVar14 = (int)ppVar3->mlevel + 1;
          goto LAB_001bc5cf;
        }
        local_1c8 = 0;
      }
      else {
        bVar8 = ppVar3->mattk[lVar17 + -4].damd;
LAB_001bc5cf:
        local_1c8 = dice(uVar14,(uint)bVar8);
      }
      uVar2 = ppVar3->mattk[lVar17 + -4].adtyp;
      iVar13 = local_1c8;
      if (uVar2 == '\x01') {
        bVar9 = resists_magm(magr);
        if (bVar9 != '\0') {
          if (magr->wormno == '\0') {
            if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bc7e3;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bc7da;
              }
              else {
LAB_001bc7da:
                if (ublindf == (obj *)0x0) goto LAB_001bccaf;
LAB_001bc7e3:
                if (ublindf->oartifact != '\x1d') goto LAB_001bccaf;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                 ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001bccaf;
            }
          }
          else {
            bVar9 = worm_known(level,magr);
            if (bVar9 == '\0') goto LAB_001bccaf;
          }
          uVar14 = *(uint *)&magr->field_0x60;
          if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar14 & 0x280) == 0) goto LAB_001bcc6f;
          }
          else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bcc6f:
            if ((u._1052_1_ & 0x20) == 0) {
              shieldeff(magr->mx,magr->my);
              pcVar18 = mon_nam(magr);
              pline("A hail of magic missiles narrowly misses %s!",pcVar18);
            }
          }
          goto LAB_001bccaf;
        }
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bc858;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bc84f;
            }
            else {
LAB_001bc84f:
              if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bc858:
              if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[magr->my][magr->mx] & 1U) == 0)) || ((magr->data->mflags3 & 0x200) == 0)
               ) goto LAB_001be01b;
          }
        }
        else {
          bVar9 = worm_known(level,magr);
          if (bVar9 == '\0') goto LAB_001be01b;
        }
        uVar14 = *(uint *)&magr->field_0x60;
        if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar14 & 0x280) == 0) goto LAB_001bcfef;
        }
        else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bcfef:
          if ((u._1052_1_ & 0x20) == 0) {
            if (magr->data == mons + 0x61) {
              pline("ZOT!");
            }
            else {
              pcVar18 = Monnam(magr);
              pline("%s is caught in a hail of magic missiles!",pcVar18);
            }
          }
        }
        goto LAB_001be01b;
      }
      if (uVar2 != ')') {
        if (uVar2 != '\b') goto LAB_001bccaf;
        if (bVar21 == 0) {
          iVar13 = 0;
          goto LAB_001be01b;
        }
        uVar14 = mt_random();
        if ((uVar14 & 1) != 0) {
          iVar13 = 0;
          goto LAB_001be01b;
        }
        pcVar18 = Monnam(magr);
        strcpy(buf,pcVar18);
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001bd1a9;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bca28;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bca1f;
          }
          else {
LAB_001bca1f:
            if (ublindf == (obj *)0x0) goto LAB_001bd220;
LAB_001bca28:
            if (ublindf->oartifact != '\x1d') goto LAB_001bd220;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[magr->my][magr->mx] & 1U) != 0)) && ((magr->data->mflags3 & 0x200) != 0))
          goto LAB_001bd1a9;
        }
        else {
          bVar9 = worm_known(level,magr);
          if (bVar9 != '\0') {
LAB_001bd1a9:
            uVar14 = *(uint *)&magr->field_0x60;
            if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar14 & 0x280) == 0) goto LAB_001bd1e8;
            }
            else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bd1e8:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar18 = mon_nam(mdef);
                pcVar18 = s_suffix(pcVar18);
                pline("%s is splashed by %s acid!",buf,pcVar18);
              }
            }
          }
        }
LAB_001bd220:
        if ((magr->mintrinsics & 0x40) == 0) goto LAB_001be01b;
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001bd621;
          if (u.uprops[0x1e].intrinsic == 0) {
            if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd2ae;
            if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd2a5;
          }
          else {
LAB_001bd2a5:
            if (ublindf == (obj *)0x0) goto LAB_001bd694;
LAB_001bd2ae:
            if (ublindf->oartifact != '\x1d') goto LAB_001bd694;
          }
          if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
               (((youmonst.data)->mflags3 & 0x100) != 0)) &&
              ((viz_array[magr->my][magr->mx] & 1U) != 0)) && ((magr->data->mflags3 & 0x200) != 0))
          goto LAB_001bd621;
LAB_001bd694:
          iVar13 = 0;
          goto LAB_001be01b;
        }
        bVar9 = worm_known(level,magr);
        if (bVar9 == '\0') goto LAB_001bd694;
LAB_001bd621:
        uVar14 = *(uint *)&magr->field_0x60;
        if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          if ((uVar14 & 0x280) != 0) goto LAB_001bd694;
        }
        else if (((uVar14 & 0x280) != 0) || (((youmonst.data)->mflags1 & 0x1000000) == 0))
        goto LAB_001bd694;
        iVar13 = 0;
        if ((u._1052_1_ & 0x20) != 0) goto LAB_001be01b;
        pcVar18 = Monnam(magr);
        pline("%s is not affected.",pcVar18);
LAB_001be013:
        iVar13 = 0;
        goto LAB_001be01b;
      }
      if ((bVar21 != 0) && (otmp != (obj *)0x0 && (mdef->field_0x61 & 1) == 0)) {
        drain_item(otmp);
      }
LAB_001bccaf:
      if ((uVar11 != 0) || ((mdef->field_0x61 & 1) != 0)) {
        uVar11 = uVar11 | bVar21;
        goto LAB_001be036;
      }
      aiStack_1b0[1] = (uint)bVar21;
      uVar14 = mt_random();
      iVar13 = 0;
      if (uVar14 % 3 == 0) goto LAB_001be01b;
      uVar2 = ppVar3->mattk[lVar17 + -4].adtyp;
      if (uVar2 == '\x02') {
        if ((magr->mintrinsics & 1) != 0) {
          if (magr->wormno == '\0') {
            if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd5b2;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd5a9;
              }
              else {
LAB_001bd5a9:
                if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bd5b2:
                if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
              }
              if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                   (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                  ((viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                 ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001be01b;
            }
          }
          else {
            bVar9 = worm_known(level,magr);
            if (bVar9 == '\0') goto LAB_001be01b;
          }
          uVar14 = *(uint *)&magr->field_0x60;
          if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar14 & 0x280) == 0) goto LAB_001bdfe0;
          }
          else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bdfe0:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar18 = Monnam(magr);
              pline("%s is mildly warmed.",pcVar18);
              iVar13 = 2;
LAB_001be009:
              golemeffects(magr,iVar13,local_1c8);
              goto LAB_001be013;
            }
          }
          goto LAB_001be01b;
        }
        if (magr->wormno == '\0') {
          if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd558;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd54f;
            }
            else {
LAB_001bd54f:
              iVar13 = local_1c8;
              if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bd558:
              iVar13 = local_1c8;
              if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (iVar13 = local_1c8, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                (iVar13 = local_1c8, (viz_array[magr->my][magr->mx] & 1U) == 0)) ||
               ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001be01b;
          }
        }
        else {
          bVar9 = worm_known(level,magr);
          iVar13 = local_1c8;
          if (bVar9 == '\0') goto LAB_001be01b;
        }
        uVar14 = *(uint *)&magr->field_0x60;
        if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
           (u.uprops[0xc].extrinsic != 0)) {
          iVar13 = local_1c8;
          if ((uVar14 & 0x280) == 0) goto LAB_001bdefa;
        }
        else {
          iVar13 = local_1c8;
          if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bdefa:
            iVar13 = local_1c8;
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar18 = Monnam(magr);
              pcVar20 = "%s is suddenly very hot!";
LAB_001bdf12:
              pline(pcVar20,pcVar18);
              iVar13 = local_1c8;
            }
          }
        }
LAB_001be01b:
        piVar1 = &magr->mhp;
        iVar12 = *piVar1;
        *piVar1 = *piVar1 - iVar13;
        if (*piVar1 == 0 || SBORROW4(iVar12,iVar13) != *piVar1 < 0) {
          monkilled(magr,"",(uint)ppVar3->mattk[lVar17 + -4].adtyp);
          uVar11 = uVar11 + bVar21 + 4;
        }
        else {
LAB_001be021:
          uVar11 = uVar11 | bVar21;
        }
      }
      else {
        if (uVar2 == '\x03') {
          if ((magr->mintrinsics & 2) == 0) {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001bd9eb;
              if (u.uprops[0x1e].intrinsic == 0) {
                if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd396;
                if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd38d;
              }
              else {
LAB_001bd38d:
                if (ublindf == (obj *)0x0) goto LAB_001bda4c;
LAB_001bd396:
                if (ublindf->oartifact != '\x1d') goto LAB_001bda4c;
              }
              if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                   (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                  ((viz_array[magr->my][magr->mx] & 1U) != 0)) &&
                 ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001bd9eb;
            }
            else {
              bVar9 = worm_known(level,magr);
              if (bVar9 != '\0') {
LAB_001bd9eb:
                uVar14 = *(uint *)&magr->field_0x60;
                if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                   (u.uprops[0xc].extrinsic != 0)) {
                  if ((uVar14 & 0x280) == 0) goto LAB_001bda2a;
                }
                else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bda2a:
                  if ((u._1052_1_ & 0x20) == 0) {
                    pcVar18 = Monnam(magr);
                    pline("%s is suddenly very cold!",pcVar18);
                  }
                }
              }
            }
LAB_001bda4c:
            iVar13 = local_1c8 / 2 + mdef->mhp;
            mdef->mhp = iVar13;
            iVar12 = mdef->mhpmax;
            if (mdef->mhpmax < iVar13) {
              mdef->mhpmax = iVar13;
              iVar12 = iVar13;
            }
            iVar13 = local_1c8;
            if ((int)((uint)mdef->m_lev * 8 + 8) < iVar12) {
              split_mon(mdef,magr);
            }
          }
          else {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd3f0;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd3e7;
                }
                else {
LAB_001bd3e7:
                  if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bd3f0:
                  if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    ((viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001be01b;
              }
            }
            else {
              bVar9 = worm_known(level,magr);
              if (bVar9 == '\0') goto LAB_001be01b;
            }
            uVar14 = *(uint *)&magr->field_0x60;
            if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar14 & 0x280) == 0) goto LAB_001bdb4b;
            }
            else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bdb4b:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar18 = Monnam(magr);
                pline("%s is mildly chilly.",pcVar18);
                iVar13 = 3;
                goto LAB_001be009;
              }
            }
          }
          goto LAB_001be01b;
        }
        if (uVar2 == '\x06') {
          if ((magr->mintrinsics & 0x10) == 0) {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd4a4;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd49b;
                }
                else {
LAB_001bd49b:
                  iVar13 = local_1c8;
                  if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bd4a4:
                  iVar13 = local_1c8;
                  if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (iVar13 = local_1c8, ((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    (iVar13 = local_1c8, (viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001be01b;
              }
            }
            else {
              bVar9 = worm_known(level,magr);
              iVar13 = local_1c8;
              if (bVar9 == '\0') goto LAB_001be01b;
            }
            uVar14 = *(uint *)&magr->field_0x60;
            if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              iVar13 = local_1c8;
              if ((uVar14 & 0x280) == 0) goto LAB_001bdd36;
            }
            else {
              iVar13 = local_1c8;
              if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bdd36:
                iVar13 = local_1c8;
                if ((u._1052_1_ & 0x20) != 0) goto LAB_001be01b;
                pcVar18 = Monnam(magr);
                pcVar20 = "%s is jolted with electricity!";
                goto LAB_001bdf12;
              }
            }
          }
          else {
            if (magr->wormno == '\0') {
              if ((viz_array[magr->my][magr->mx] & 2U) == 0) {
                if (u.uprops[0x1e].intrinsic == 0) {
                  if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd4fe;
                  if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd4f5;
                }
                else {
LAB_001bd4f5:
                  if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bd4fe:
                  if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
                }
                if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                     (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                    ((viz_array[magr->my][magr->mx] & 1U) == 0)) ||
                   ((magr->data->mflags3 & 0x200) == 0)) goto LAB_001be01b;
              }
            }
            else {
              bVar9 = worm_known(level,magr);
              if (bVar9 == '\0') goto LAB_001be01b;
            }
            uVar14 = *(uint *)&magr->field_0x60;
            if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
               (u.uprops[0xc].extrinsic != 0)) {
              if ((uVar14 & 0x280) == 0) goto LAB_001bde15;
            }
            else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bde15:
              if ((u._1052_1_ & 0x20) == 0) {
                pcVar18 = Monnam(magr);
                pline("%s is mildly tingled.",pcVar18);
                iVar13 = 6;
                goto LAB_001be009;
              }
            }
          }
          goto LAB_001be01b;
        }
        if (uVar2 == '\f') {
          if ((*(uint *)&magr->field_0x60 >> 0x14 & 1) != 0) goto LAB_001be01b;
          uVar14 = *(uint *)&magr->field_0x60 | 0x100000;
          *(uint *)&magr->field_0x60 = uVar14;
          if (magr->wormno == '\0') {
            if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001bdbe7;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd44a;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd441;
            }
            else {
LAB_001bd441:
              if (ublindf == (obj *)0x0) goto LAB_001be01b;
LAB_001bd44a:
              if (ublindf->oartifact != '\x1d') goto LAB_001be01b;
            }
            if ((((u.uprops[0x40].extrinsic == 0 && u.uprops[0x40].intrinsic == 0) &&
                 (((youmonst.data)->mflags3 & 0x100) == 0)) ||
                ((viz_array[magr->my][magr->mx] & 1U) == 0)) || ((magr->data->mflags3 & 0x200) == 0)
               ) goto LAB_001be01b;
          }
          else {
            bVar9 = worm_known(level,magr);
            if (bVar9 == '\0') goto LAB_001be01b;
            uVar14 = *(uint *)&magr->field_0x60;
          }
LAB_001bdbe7:
          if ((((uVar14 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
             (u.uprops[0xc].extrinsic != 0)) {
            if ((uVar14 & 0x280) == 0) goto LAB_001bdc2d;
          }
          else if (((uVar14 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bdc2d:
            if ((u._1052_1_ & 0x20) == 0) {
              pcVar18 = Monnam(magr);
              pcVar20 = stagger(magr->data,"stagger");
              pcVar20 = makeplural(pcVar20);
              pline("%s %s...",pcVar18,pcVar20);
              goto LAB_001be013;
            }
          }
          goto LAB_001be01b;
        }
        if (uVar2 != '\x0e') goto LAB_001be01b;
        if (0x7e < local_1c8) {
          local_1c8 = 0x7f;
        }
        if (ppVar3 == mons + 0x1e) {
          uVar11 = 1;
          if ((magr->field_0x62 & 2) != 0) {
            uVar14 = ppVar4->mflags1;
            uVar11 = 1;
            if ((uVar14 >> 0xc & 1) == 0) {
              uVar11 = 1;
              if (((*(uint *)&mdef->field_0x60 >> 0x11 & 1) != 0) &&
                 (uVar11 = 1,
                 ((uVar14 >> 0x18 & 1) == 0 & (byte)((*(uint *)&mdef->field_0x60 & 2) >> 1)) == 0))
              {
                pcVar18 = mon_nam(mdef);
                pcVar18 = s_suffix(pcVar18);
                sprintf(buf,"%s gaze is reflected by %%s %%s.",pcVar18);
                if (magr->wormno == '\0') {
                  if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001be4e6;
                  if (u.uprops[0x1e].intrinsic == 0) {
                    if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001be313;
                    if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001be30a;
LAB_001be488:
                    if (((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                        (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                       ((viz_array[magr->my][magr->mx] & 1U) != 0)) {
                      pcVar18 = (char *)0x0;
                      if ((magr->data->mflags3 & 0x200) != 0) goto LAB_001be4e6;
                      goto LAB_001be56b;
                    }
                  }
                  else {
LAB_001be30a:
                    if (ublindf != (obj *)0x0) {
LAB_001be313:
                      if (ublindf->oartifact == '\x1d') goto LAB_001be488;
                    }
                  }
LAB_001be55c:
                  pcVar18 = (char *)0x0;
                }
                else {
                  bVar9 = worm_known(level,magr);
                  if (bVar9 == '\0') {
LAB_001be53e:
                    pcVar18 = (char *)0x0;
                  }
                  else {
LAB_001be4e6:
                    uVar11 = *(uint *)&magr->field_0x60;
                    if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                       (u.uprops[0xc].extrinsic != 0)) {
                      if ((uVar11 & 0x280) != 0) goto LAB_001be53e;
                    }
                    else {
                      if ((uVar11 & 0x280) != 0) goto LAB_001be55c;
                      pcVar18 = (char *)0x0;
                      if (((youmonst.data)->mflags1 & 0x1000000) == 0) goto LAB_001be56b;
                    }
                    pcVar18 = (char *)0x0;
                    if ((u._1052_1_ & 0x20) == 0) {
                      pcVar18 = buf;
                    }
                  }
                }
LAB_001be56b:
                bVar9 = mon_reflects(magr,pcVar18);
                uVar11 = aiStack_1b0[1];
                if (bVar9 == '\0') {
                  pcVar18 = Monnam(magr);
                  strcpy(buf,pcVar18);
                  if (magr->wormno == '\0') {
                    if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001be685;
                    if (u.uprops[0x1e].intrinsic == 0) {
                      if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001be617;
                      if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001be60e;
                    }
                    else {
LAB_001be60e:
                      if (ublindf == (obj *)0x0) goto LAB_001be713;
LAB_001be617:
                      if (ublindf->oartifact != '\x1d') goto LAB_001be713;
                    }
                    if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                         (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                        ((viz_array[magr->my][magr->mx] & 1U) != 0)) &&
                       ((magr->data->mflags3 & 0x200) != 0)) goto LAB_001be685;
                  }
                  else {
                    bVar9 = worm_known(level,magr);
                    if (bVar9 != '\0') {
LAB_001be685:
                      uVar11 = *(uint *)&magr->field_0x60;
                      if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                         (u.uprops[0xc].extrinsic != 0)) {
                        if ((uVar11 & 0x280) == 0) goto LAB_001be6d8;
                      }
                      else if (((uVar11 & 0x280) == 0) &&
                              (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001be6d8:
                        if ((u._1052_1_ & 0x20) == 0) {
                          pcVar18 = mon_nam(mdef);
                          pcVar18 = s_suffix(pcVar18);
                          pline("%s is frozen by %s gaze!",buf,pcVar18);
                        }
                      }
                    }
                  }
LAB_001be713:
                  magr->field_0x62 = magr->field_0x62 & 0xfb;
                  magr->mfrozen = (uchar)local_1c8;
                  uVar11 = aiStack_1b0[1];
                }
              }
            }
          }
        }
        else {
          pcVar18 = Monnam(magr);
          strcpy(buf,pcVar18);
          if (magr->wormno == '\0') {
            if ((viz_array[magr->my][magr->mx] & 2U) != 0) goto LAB_001bd907;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_001bd310;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_001bd307;
            }
            else {
LAB_001bd307:
              if (ublindf == (obj *)0x0) goto LAB_001bd97a;
LAB_001bd310:
              if (ublindf->oartifact != '\x1d') goto LAB_001bd97a;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[magr->my][magr->mx] & 1U) != 0)) && ((magr->data->mflags3 & 0x200) != 0)
               ) goto LAB_001bd907;
          }
          else {
            bVar9 = worm_known(level,magr);
            if (bVar9 != '\0') {
LAB_001bd907:
              uVar11 = *(uint *)&magr->field_0x60;
              if ((((uVar11 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar11 & 0x280) == 0) goto LAB_001bd946;
              }
              else if (((uVar11 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_001bd946:
                if ((u._1052_1_ & 0x20) == 0) {
                  pcVar18 = mon_nam(mdef);
                  pline("%s is frozen by %s.",buf,pcVar18);
                }
              }
            }
          }
LAB_001bd97a:
          magr->field_0x62 = magr->field_0x62 & 0xfb;
          magr->mfrozen = (uchar)local_1c8;
          uVar11 = aiStack_1b0[1];
        }
      }
LAB_001be036:
      res[uVar22] = uVar11;
    }
LAB_001be042:
    if ((uVar11 & 2) != 0) {
      return uVar11;
    }
    if (bVar21 != 0) {
      mdef->field_0x62 = mdef->field_0x62 & 0xf7;
    }
    if ((uVar11 & 4) != 0) {
      return uVar11;
    }
LAB_001be060:
    if ((*(uint *)&magr->field_0x60 & 0xc0000) != 0x40000) {
      return uVar11;
    }
    if ((uVar11 & 1) != 0) {
      bVar6 = 1;
    }
    uVar22 = uVar22 + 1;
  } while( true );
}

Assistant:

int mattackm(struct monst *magr, struct monst *mdef)
{
    int		    i,		/* loop counter */
		    tmp,	/* amour class difference */
		    strike,	/* hit this attack */
		    attk,	/* attack attempted this time */
		    struck = 0,	/* hit at least once */
		    res[NATTK];	/* results of all attacks */
    const struct attack *mattk;
    struct attack alt_attk;
    const struct permonst *pa, *pd;

    if (!magr || !mdef) return MM_MISS;		/* mike@genat */
    if (!magr->mcanmove || magr->msleeping) return MM_MISS;
    pa = magr->data;
    pd = mdef->data;

    /* Grid bugs cannot attack at an angle. */
    if (pa == &mons[PM_GRID_BUG] && magr->mx != mdef->mx
						&& magr->my != mdef->my)
	return MM_MISS;

    /* Calculate the armour class differential. */
    tmp = find_mac(mdef) + magr->m_lev;
    if (mdef->mconf || !mdef->mcanmove || mdef->msleeping) {
	tmp += 4;
	mdef->msleeping = 0;
    }

    /* undetect monsters become un-hidden if they are attacked */
    if (mdef->mundetected) {
	mdef->mundetected = 0;
	newsym(mdef->mx, mdef->my);
	if (canseemon(level, mdef) && !sensemon(mdef)) {
	    if (u.usleep) pline("You dream of %s.",
				(mdef->data->geno & G_UNIQ) ?
				a_monnam(mdef) : makeplural(m_monnam(mdef)));
	    else pline("Suddenly, you notice %s.", a_monnam(mdef));
	}
    }

    /* Elves hate orcs. */
    if (is_elf(pa) && is_orc(pd)) tmp++;


    /* Set up the visibility of action */
    vis = (cansee(magr->mx,magr->my) && cansee(mdef->mx,mdef->my) && (canspotmon(level, magr) || canspotmon(level, mdef)));

    /*	Set flag indicating monster has moved this turn.  Necessary since a
     *	monster might get an attack out of sequence (i.e. before its move) in
     *	some cases, in which case this still counts as its move for the round
     *	and it shouldn't move again.
     */
    magr->mlstmv = moves;

    /* Now perform all attacks for the monster. */
    for (i = 0; i < NATTK; i++) {
	res[i] = MM_MISS;
	mattk = getmattk(pa, i, res, &alt_attk);
	otmp = NULL;
	attk = 1;
	switch (mattk->aatyp) {
	    case AT_WEAP:		/* "hand to hand" attacks */
		if (magr->weapon_check == NEED_WEAPON || !MON_WEP(magr)) {
		    magr->weapon_check = NEED_HTH_WEAPON;
		    if (mon_wield_item(magr) != 0) return 0;
		}
		possibly_unwield(magr, FALSE);
		otmp = MON_WEP(magr);

		if (otmp) {
		    if (vis) mswingsm(magr, mdef, otmp);
		    tmp += hitval(otmp, mdef);
		}
		/* fall through */
	    case AT_CLAW:
	    case AT_KICK:
	    case AT_BITE:
	    case AT_STNG:
	    case AT_TUCH:
	    case AT_BUTT:
	    case AT_TENT:
		/* Nymph that teleported away on first attack? */
		if (distmin(magr->mx,magr->my,mdef->mx,mdef->my) > 1)
		    return MM_MISS;
		/* Monsters won't attack cockatrices physically if they
		 * have a weapon instead.  They won't attack
		 * disintegrators with a weapon either.  This instinct
		 * doesn't work for players, or under conflict or
		 * confusion.
		 */
		if (!magr->mconf && !Conflict && otmp &&
		    ((touch_disintegrates(mdef->data) &&
		      (mattk->aatyp == AT_WEAP || !resists_disint(magr))) ||
		     (mattk->aatyp != AT_WEAP && touch_petrifies(mdef->data)))) {
		    strike = 0;
		    break;
		}
		dieroll = rnd(20 + i);
		strike = (tmp > dieroll);
		/* KMH -- don't accumulate to-hit bonuses */
		if (otmp)
		    tmp -= hitval(otmp, mdef);
		if (strike) {
		    res[i] = hitmm(magr, mdef, mattk);
		    if ((mdef->data == &mons[PM_BLACK_PUDDING] || mdef->data == &mons[PM_BROWN_PUDDING])
		       && otmp && objects[otmp->otyp].oc_material == IRON
		       && mdef->mhp > 1 && !mdef->mcan)
		    {
			if (clone_mon(mdef, 0, 0)) {
			    if (vis) {
				char buf[BUFSZ];

				strcpy(buf, Monnam(mdef));
				pline("%s divides as %s hits it!", buf, mon_nam(magr));
			    }
			}
		    }
		} else
		    missmm(magr, mdef, mattk);
		break;

	    case AT_HUGS:	/* automatic if prev two attacks succeed */
		strike = (i >= 2 && res[i-1] == MM_HIT && res[i-2] == MM_HIT);
		if (strike)
		    res[i] = hitmm(magr, mdef, mattk);

		break;

	    case AT_GAZE:
		strike = 0;	/* will not wake up a sleeper */
		res[i] = gazemm(magr, mdef, mattk);
		break;

	    case AT_EXPL:
		res[i] = explmm(magr, mdef, mattk);
		if (res[i] == MM_MISS) { /* cancelled--no attack */
		    strike = 0;
		    attk = 0;
		} else
		    strike = 1;	/* automatic hit */
		break;

	    case AT_ENGL:
		if (u.usteed && (mdef == u.usteed)) {
		    strike = 0;
		    break;
		} 
		/* Engulfing attacks are directed at the hero if
		 * possible. -dlc
		 */
		if (u.uswallow && magr == u.ustuck)
		    strike = 0;
		else {
		    if ((strike = (tmp > rnd(20+i))))
			res[i] = gulpmm(magr, mdef, mattk);
		    else
			missmm(magr, mdef, mattk);
		}
		break;

	    default:		/* no attack */
		strike = 0;
		attk = 0;
		break;
	}

	if (attk && !(res[i] & MM_AGR_DIED))
	    res[i] = passivemm(magr, mdef, strike, res[i] & MM_DEF_DIED);

	if (res[i] & MM_DEF_DIED) return res[i];

	/*
	 *  Wake up the defender.  NOTE:  this must follow the check
	 *  to see if the defender died.  We don't want to modify
	 *  unallocated monsters!
	 */
	if (strike) mdef->msleeping = 0;

	if (res[i] & MM_AGR_DIED)  return res[i];
	/* return if aggressor can no longer attack */
	if (!magr->mcanmove || magr->msleeping) return res[i];
	if (res[i] & MM_HIT) struck = 1;	/* at least one hit */
    }

    return struck ? MM_HIT : MM_MISS;
}